

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  long lVar1;
  int iVar2;
  long lVar3;
  OneofDescriptor *pOVar4;
  char *pcVar5;
  long lVar6;
  int __c;
  FieldDescriptor *pFVar7;
  FieldDescriptor *field_local;
  int new_index;
  
  pFVar7 = field;
  field_local = field;
  if (*(char *)((long)this + 0x40) == '\0') {
    if (*(long **)((long)this + 0x48) == *(long **)((long)this + 0x50)) goto LAB_002e02cd;
    lVar1 = **(long **)((long)this + 0x48);
    lVar3 = 0;
    lVar6 = 0;
    if ((*(byte *)(lVar1 + 1) & 0x10) != 0) {
      lVar6 = *(long *)(lVar1 + 0x28);
    }
    if (((byte)field[1] & 0x10) != 0) {
      lVar3 = *(long *)(field + 0x28);
    }
    if (lVar6 == lVar3) goto LAB_002e02cd;
  }
  GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush((LazySerializerEmitter *)this);
LAB_002e02cd:
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    if (((*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') && ((~(byte)field[1] & 0x60) != 0)) &&
       (*(char *)((long)this + 0x40) == '\0')) {
      lVar1 = *this;
      pcVar5 = FieldDescriptor::index(field,(char *)pFVar7,__c);
      iVar2 = *(int *)(*(long *)(lVar1 + 0x158) + (long)(int)pcVar5 * 4) / 0x20;
      if (*(int *)((long)this + 0x60) != iVar2) {
        new_index = iVar2;
        Formatter::operator()
                  ((Formatter *)((long)this + 8),"cached_has_bits = _has_bits_[$1$];\n",&new_index);
        *(int *)((long)this + 0x60) = new_index;
      }
    }
    GenerateSerializeOneField(*this,*(Printer **)((long)this + 8),field,*(int *)((long)this + 0x60))
    ;
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x48),&field_local);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (!field->real_containing_oneof()) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            format_("cached_has_bits = _has_bits_[$1$];\n", new_index);

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(format_.printer(), field,
                                       cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }